

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O3

void helper_srst(CPUS390XState_conflict *env,uint32_t r1,uint32_t r2)

{
  target_ulong ptr;
  ulong uVar1;
  ulong uVar2;
  uint32_t uVar3;
  target_ulong tVar4;
  int iVar5;
  uint uVar6;
  uint64_t uVar7;
  long lVar8;
  uintptr_t unaff_retaddr;
  uint64_t *local_48;
  
  uVar1 = env->regs[0];
  if ((uVar1 & 0xffffff00) != 0) {
    tcg_s390_program_interrupt_s390x(env,6,unaff_retaddr);
  }
  uVar7 = env->regs[(int)r2];
  uVar2 = (env->psw).mask;
  if ((uVar2 >> 0x20 & 1) == 0) {
    iVar5 = (int)uVar2;
    uVar6 = 0x7fffffff;
    if (-1 < iVar5) {
      uVar6 = 0xffffff;
    }
    uVar7 = (uint64_t)((uint)uVar7 & uVar6);
    local_48 = env->regs + (int)r1;
    if (iVar5 < 0) {
      tVar4 = (target_ulong)((uint)*local_48 & 0x7fffffff);
    }
    else {
      tVar4 = (target_ulong)((uint)*local_48 & 0xffffff);
    }
  }
  else {
    local_48 = env->regs + (int)r1;
    tVar4 = *local_48;
  }
  lVar8 = 0;
  while( true ) {
    if ((uVar7 - tVar4) + lVar8 == 0) {
      env->cc_op = 2;
      return;
    }
    ptr = uVar7 + lVar8;
    uVar3 = cpu_ldub_data_ra_s390x(env,ptr,unaff_retaddr);
    if ((uVar3 & 0xff) == (uint)uVar1) break;
    lVar8 = lVar8 + 1;
    if (lVar8 == 0x2000) {
      env->cc_op = 3;
      uVar1 = (env->psw).mask;
      if ((uVar1 & 0x100000000) == 0) {
        uVar6 = (uint)(uVar7 + 0x2000);
        if ((int)uVar1 < 0) {
          *(uint *)(env->regs + (int)r2) = uVar6 & 0x7fffffff;
        }
        else {
          env->regs[(int)r2] = (ulong)(uVar6 & 0xffffff) | env->regs[(int)r2] & 0xffffffffff000000;
        }
      }
      else {
        env->regs[(int)r2] = uVar7 + 0x2000;
      }
      return;
    }
  }
  env->cc_op = 1;
  uVar1 = (env->psw).mask;
  if ((uVar1 & 0x100000000) != 0) {
    *local_48 = ptr;
    return;
  }
  if (-1 < (int)uVar1) {
    *local_48 = (ulong)((uint)ptr & 0xffffff) | *local_48 & 0xffffffffff000000;
    return;
  }
  *(uint *)local_48 = (uint)ptr & 0x7fffffff;
  return;
}

Assistant:

void HELPER(srst)(CPUS390XState *env, uint32_t r1, uint32_t r2)
{
    uintptr_t ra = GETPC();
    uint64_t end, str;
    uint32_t len;
    uint8_t v, c = env->regs[0];

    /* Bits 32-55 must contain all 0.  */
    if (env->regs[0] & 0xffffff00u) {
        tcg_s390_program_interrupt(env, PGM_SPECIFICATION, ra);
    }

    str = get_address(env, r2);
    end = get_address(env, r1);

    /* Lest we fail to service interrupts in a timely manner, limit the
       amount of work we're willing to do.  For now, let's cap at 8k.  */
    for (len = 0; len < 0x2000; ++len) {
        if (str + len == end) {
            /* Character not found.  R1 & R2 are unmodified.  */
            env->cc_op = 2;
            return;
        }
        v = cpu_ldub_data_ra(env, str + len, ra);
        if (v == c) {
            /* Character found.  Set R1 to the location; R2 is unmodified.  */
            env->cc_op = 1;
            set_address(env, r1, str + len);
            return;
        }
    }

    /* CPU-determined bytes processed.  Advance R2 to next byte to process.  */
    env->cc_op = 3;
    set_address(env, r2, str + len);
}